

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator.hpp
# Opt level: O2

size_t __thiscall
ear::dsp::GainInterpolator<ear::dsp::LinearInterpVector>::find_block
          (GainInterpolator<ear::dsp::LinearInterpVector> *this,SampleIndex sample_idx)

{
  int iVar1;
  int iVar2;
  invalid_argument *this_00;
  ulong block_idx;
  size_t block_idx_00;
  allocator<char> local_39;
  string local_38;
  
  block_idx = this->last_block;
  if ((ulong)((long)(this->interp_points).
                    super__Vector_base<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->interp_points).
                    super__Vector_base<std::pair<long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<long,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < block_idx) {
    this->last_block = 0;
    block_idx = 0;
  }
  iVar1 = block_cmp(this,block_idx,sample_idx);
  iVar2 = iVar1;
  while( true ) {
    if (iVar2 == 0) {
      return this->last_block;
    }
    block_idx_00 = (long)iVar2 + this->last_block;
    this->last_block = block_idx_00;
    if (iVar2 != iVar1) break;
    iVar2 = block_cmp(this,block_idx_00,sample_idx);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"interpolation points are not sorted",&local_39);
  invalid_argument::invalid_argument(this_00,&local_38);
  __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t find_block(SampleIndex sample_idx) {
        // last_block could be outside the allowed range if interp_points
        // changed since the last call
        if (last_block > interp_points.size()) last_block = 0;

        // move in the direction given by block_cmp until we find the right
        // block (cmp == 0); this is slightly complicated by checking that we
        // are making progress.
        int cmp = block_cmp(last_block, sample_idx);
        int first_cmp = cmp;
        while (cmp != 0) {
          last_block += cmp;
          if (cmp != first_cmp)
            throw invalid_argument("interpolation points are not sorted");
          cmp = block_cmp(last_block, sample_idx);
        }

        return last_block;
      }